

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O3

CURLcode Curl_dynhds_h1_add_line(dynhds *dynhds,char *line,size_t line_len)

{
  dynhds_entry *pdVar1;
  size_t sVar2;
  size_t sVar3;
  CURLcode CVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  dynhds_entry *pdVar9;
  size_t sVar10;
  char *pcVar11;
  long lVar12;
  size_t __n;
  
  CVar4 = CURLE_OK;
  if (line_len != 0 && line != (char *)0x0) {
    if ((*line == ' ') || (*line == '\t')) {
      if (dynhds->hds_len != 0) {
        lVar12 = -line_len;
        do {
          if ((*line != ' ') && (*line != '\t')) {
            pdVar1 = dynhds->hds[dynhds->hds_len - 1];
            sVar10 = pdVar1->valuelen;
            pdVar9 = (dynhds_entry *)(*Curl_ccalloc)(1,((pdVar1->namelen + sVar10) - lVar12) + 0x23)
            ;
            if (pdVar9 != (dynhds_entry *)0x0) {
              pdVar9->name = (char *)(pdVar9 + 1);
              memcpy(pdVar9 + 1,pdVar1->name,pdVar1->namelen);
              sVar2 = pdVar1->namelen;
              pdVar9->namelen = sVar2;
              pcVar11 = (char *)((long)&pdVar9[1].name + sVar2 + 1);
              pdVar9->value = pcVar11;
              memcpy(pcVar11,pdVar1->value,pdVar1->valuelen);
              sVar3 = pdVar1->valuelen;
              *(undefined1 *)((long)&pdVar9[1].name + sVar3 + sVar2 + 1) = 0x20;
              memcpy((void *)((long)&pdVar9[1].name + sVar3 + sVar2 + 2),line,-lVar12);
              pdVar9->valuelen = (sVar10 - lVar12) + 1;
              dynhds->hds[dynhds->hds_len - 1] = pdVar9;
              (*Curl_cfree)(pdVar1);
              return CURLE_OK;
            }
            return CURLE_OUT_OF_MEMORY;
          }
          line = line + 1;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0);
      }
    }
    else {
      pvVar5 = memchr(line,0x3a,line_len);
      if (pvVar5 != (void *)0x0) {
        uVar6 = ((long)pvVar5 - (long)line) + 1;
        uVar7 = uVar6;
        for (pcVar11 = (char *)((long)pvVar5 + 1);
            (uVar6 < line_len && ((*pcVar11 == ' ' || (uVar7 = uVar6, *pcVar11 == '\t'))));
            pcVar11 = pcVar11 + 1) {
          uVar6 = uVar6 + 1;
          uVar7 = line_len;
        }
        __n = line_len - uVar7;
        pvVar8 = memchr(pcVar11,0xd,__n);
        if (pvVar8 == (void *)0x0) {
          pvVar8 = memchr(pcVar11,10,__n);
        }
        sVar10 = (long)pvVar8 - (long)pcVar11;
        if (pvVar8 == (void *)0x0) {
          sVar10 = __n;
        }
        CVar4 = Curl_dynhds_add(dynhds,line,(long)pvVar5 - (long)line,pcVar11,sVar10);
        return CVar4;
      }
    }
    CVar4 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  return CVar4;
}

Assistant:

CURLcode Curl_dynhds_h1_add_line(struct dynhds *dynhds,
                                 const char *line, size_t line_len)
{
  const char *p;
  const char *name;
  size_t namelen;
  const char *value;
  size_t valuelen, i;

  if(!line || !line_len)
    return CURLE_OK;

  if((line[0] == ' ') || (line[0] == '\t')) {
    struct dynhds_entry *e, *e2;
    /* header continuation, yikes! */
    if(!dynhds->hds_len)
      return CURLE_BAD_FUNCTION_ARGUMENT;

    while(line_len && ISBLANK(line[0])) {
      ++line;
      --line_len;
    }
    if(!line_len)
      return CURLE_BAD_FUNCTION_ARGUMENT;
    e = dynhds->hds[dynhds->hds_len-1];
    e2 = entry_append(e, line, line_len);
    if(!e2)
      return CURLE_OUT_OF_MEMORY;
    dynhds->hds[dynhds->hds_len-1] = e2;
    entry_free(e);
    return CURLE_OK;
  }
  else {
    p = memchr(line, ':', line_len);
    if(!p)
      return CURLE_BAD_FUNCTION_ARGUMENT;
    name = line;
    namelen = p - line;
    p++; /* move past the colon */
    for(i = namelen + 1; i < line_len; ++i, ++p) {
      if(!ISBLANK(*p))
        break;
    }
    value = p;
    valuelen = line_len - i;

    p = memchr(value, '\r', valuelen);
    if(!p)
      p = memchr(value, '\n', valuelen);
    if(p)
      valuelen = (size_t)(p - value);

    return Curl_dynhds_add(dynhds, name, namelen, value, valuelen);
  }
}